

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

void Java_fr_limsi_wapiti_WapitiJNI_opt_1parse
               (JNIEnv *jenv,jclass jcls,jint jarg1,jlong jarg2,jlong jarg3,jobject jarg3_)

{
  opt_t *in_RSI;
  char **in_RDI;
  opt_t *arg3;
  char **arg2;
  int arg1;
  
  opt_parse(arg3._4_4_,in_RDI,in_RSI);
  return;
}

Assistant:

SWIGEXPORT void JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1parse(JNIEnv *jenv, jclass jcls, jint jarg1, jlong jarg2, jlong jarg3, jobject jarg3_) {
  int arg1 ;
  char **arg2 = (char **) 0 ;
  opt_t *arg3 = (opt_t *) 0 ;
  
  (void)jenv;
  (void)jcls;
  (void)jarg3_;
  arg1 = (int)jarg1; 
  arg2 = *(char ***)&jarg2; 
  arg3 = *(opt_t **)&jarg3; 
  opt_parse(arg1,arg2,arg3);
}